

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::IsSafeToTransferInPrepass(GlobOpt *this,StackSym *srcSym,ValueInfo *srcValueInfo)

{
  bool bVar1;
  BOOLEAN BVar2;
  StackSym *pSVar3;
  byte local_25;
  int32 local_24;
  ValueInfo *pVStack_20;
  int32 intConstantValue;
  ValueInfo *srcValueInfo_local;
  StackSym *srcSym_local;
  GlobOpt *this_local;
  
  pVStack_20 = srcValueInfo;
  srcValueInfo_local = (ValueInfo *)srcSym;
  srcSym_local = (StackSym *)this;
  bVar1 = StackSym::IsFromByteCodeConstantTable(srcSym);
  local_25 = 1;
  if (!bVar1) {
    bVar1 = ValueInfo::TryGetIntConstantValue(pVStack_20,&local_24,false);
    if ((bVar1) && (bVar1 = Js::TaggedInt::IsOverflow(local_24), !bVar1)) {
      pSVar3 = GetTaggedIntConstantStackSym(this,local_24);
      local_25 = 1;
      if (pSVar3 == (StackSym *)srcValueInfo_local) goto LAB_0058b4fb;
    }
    BVar2 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((this->currentBlock->loop->regAlloc).liveOnBackEdgeSyms,
                       *(BVIndex *)&srcValueInfo_local->symStore);
    local_25 = 1;
    if (BVar2 != '\0') {
      bVar1 = Loop::IsSymAssignedToInSelfOrParents
                        (this->currentBlock->loop,(StackSym *)srcValueInfo_local);
      local_25 = bVar1 ^ 0xff;
    }
  }
LAB_0058b4fb:
  return (bool)(local_25 & 1);
}

Assistant:

bool
GlobOpt::IsSafeToTransferInPrepass(StackSym * const srcSym, ValueInfo *const srcValueInfo) const
{
    int32 intConstantValue;
    return
        srcSym->IsFromByteCodeConstantTable() ||
        (
            srcValueInfo->TryGetIntConstantValue(&intConstantValue) &&
            !Js::TaggedInt::IsOverflow(intConstantValue) &&
            GetTaggedIntConstantStackSym(intConstantValue) == srcSym
            ) ||
        !currentBlock->loop->regAlloc.liveOnBackEdgeSyms->Test(srcSym->m_id) ||
        !currentBlock->loop->IsSymAssignedToInSelfOrParents(srcSym);
}